

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  int iVar551;
  ulong uVar552;
  ulong uVar553;
  ulong uVar554;
  ulong uVar555;
  ulong uVar556;
  ulong uVar557;
  ulong uVar558;
  ulong uVar559;
  ulong uVar560;
  ulong uVar561;
  ulong uVar562;
  ulong uVar563;
  ulong uVar564;
  ulong uVar565;
  ulong uVar566;
  uchar *a;
  int overflow;
  uint64_t tmp3_2;
  secp256k1_fe i;
  uint64_t tmp3_5;
  int vflag;
  secp256k1_ge p;
  secp256k1_fe xd;
  secp256k1_fe xn;
  secp256k1_fe t;
  secp256k1_fe u;
  uint local_26c;
  uchar *local_268;
  uchar *local_260;
  uchar *local_258;
  secp256k1_fe local_250;
  secp256k1_fe local_228;
  ulong local_200;
  secp256k1_gej local_1f8;
  secp256k1_ge local_170;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  ulong local_f8;
  secp256k1_fe local_f0;
  secp256k1_scalar local_c8;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (output == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_5();
  }
  else if (ell_a64 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_4();
  }
  else if (ell_b64 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_3();
  }
  else if (seckey32 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_2();
  }
  else {
    if (hashfp != (secp256k1_ellswift_xdh_hash_function)0x0) {
      a = ell_a64;
      if (party == 0) {
        a = ell_b64;
      }
      local_268 = output;
      local_260 = ell_a64;
      local_258 = ell_b64;
      secp256k1_fe_impl_set_b32_mod(&local_58,a);
      secp256k1_fe_impl_set_b32_mod(&local_80,a + 0x20);
      secp256k1_ellswift_xswiftec_frac_var(&local_a8,&local_f0,&local_58,&local_80);
      secp256k1_scalar_set_b32(&local_c8,seckey32,(int *)&local_26c);
      local_26c = (uint)(((local_c8.d[1] == 0 && local_c8.d[0] == 0) && local_c8.d[2] == 0) &&
                        local_c8.d[3] == 0);
      uVar553 = (long)(int)local_26c - 1;
      local_c8.d[0] = (ulong)local_26c | local_c8.d[0] & uVar553;
      local_c8.d[1] = local_c8.d[1] & uVar553;
      local_c8.d[2] = local_c8.d[2] & uVar553;
      local_c8.d[3] = uVar553 & local_c8.d[3];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_a8.n[0] * 2;
      auVar261._8_8_ = 0;
      auVar261._0_8_ = local_a8.n[3];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_a8.n[1] * 2;
      auVar262._8_8_ = 0;
      auVar262._0_8_ = local_a8.n[2];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_a8.n[4];
      auVar263._8_8_ = 0;
      auVar263._0_8_ = local_a8.n[4];
      uVar552 = SUB168(auVar3 * auVar263,0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar552 & 0xfffffffffffff;
      auVar1 = auVar2 * auVar262 + auVar1 * auVar261 + auVar4 * ZEXT816(0x1000003d10);
      uVar554 = auVar1._0_8_;
      auVar481._8_8_ = 0;
      auVar481._0_8_ = uVar554 >> 0x34 | auVar1._8_8_ << 0xc;
      uVar553 = local_a8.n[4] * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_a8.n[0];
      auVar264._8_8_ = 0;
      auVar264._0_8_ = uVar553;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_a8.n[1] * 2;
      auVar265._8_8_ = 0;
      auVar265._0_8_ = local_a8.n[3];
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_a8.n[2];
      auVar266._8_8_ = 0;
      auVar266._0_8_ = local_a8.n[2];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar552 >> 0x34 | SUB168(auVar3 * auVar263,8) << 0xc;
      auVar1 = auVar5 * auVar264 + auVar481 + auVar6 * auVar265 + auVar7 * auVar266 +
               auVar8 * ZEXT816(0x1000003d10);
      uVar555 = auVar1._0_8_;
      auVar482._8_8_ = 0;
      auVar482._0_8_ = uVar555 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_a8.n[0];
      auVar267._8_8_ = 0;
      auVar267._0_8_ = local_a8.n[0];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_a8.n[1];
      auVar268._8_8_ = 0;
      auVar268._0_8_ = uVar553;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_a8.n[2] * 2;
      auVar269._8_8_ = 0;
      auVar269._0_8_ = local_a8.n[3];
      auVar1 = auVar10 * auVar268 + auVar482 + auVar11 * auVar269;
      uVar552 = auVar1._0_8_;
      auVar484._8_8_ = 0;
      auVar484._0_8_ = uVar552 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar270._8_8_ = 0;
      auVar270._0_8_ = (uVar552 & 0xfffffffffffff) << 4 | (uVar555 & 0xfffffffffffff) >> 0x30;
      auVar1 = auVar9 * auVar267 + ZEXT816(0x1000003d1) * auVar270;
      uVar556 = auVar1._0_8_;
      uVar552 = uVar556 & 0xfffffffffffff;
      auVar483._8_8_ = 0;
      auVar483._0_8_ = uVar556 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_a8.n[0] * 2;
      auVar271._8_8_ = 0;
      auVar271._0_8_ = local_a8.n[1];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_a8.n[2];
      auVar272._8_8_ = 0;
      auVar272._0_8_ = uVar553;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_a8.n[3];
      auVar273._8_8_ = 0;
      auVar273._0_8_ = local_a8.n[3];
      auVar2 = auVar13 * auVar272 + auVar484 + auVar14 * auVar273;
      uVar556 = auVar2._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar556 & 0xfffffffffffff;
      auVar1 = auVar12 * auVar271 + auVar483 + auVar15 * ZEXT816(0x1000003d10);
      uVar557 = auVar1._0_8_;
      auVar486._8_8_ = 0;
      auVar486._0_8_ = uVar556 >> 0x34 | auVar2._8_8_ << 0xc;
      uVar556 = uVar557 & 0xfffffffffffff;
      auVar485._8_8_ = 0;
      auVar485._0_8_ = uVar557 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_a8.n[0] * 2;
      auVar274._8_8_ = 0;
      auVar274._0_8_ = local_a8.n[2];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_a8.n[1];
      auVar275._8_8_ = 0;
      auVar275._0_8_ = local_a8.n[1];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_a8.n[3];
      auVar276._8_8_ = 0;
      auVar276._0_8_ = uVar553;
      auVar486 = auVar18 * auVar276 + auVar486;
      uVar557 = auVar486._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar557 & 0xfffffffffffff;
      auVar1 = auVar16 * auVar274 + auVar485 + auVar17 * auVar275 + auVar19 * ZEXT816(0x1000003d10);
      uVar558 = auVar1._0_8_;
      uVar553 = uVar558 & 0xfffffffffffff;
      auVar487._8_8_ = 0;
      auVar487._0_8_ = (uVar558 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar554 & 0xfffffffffffff);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar557 >> 0x34 | auVar486._8_8_ << 0xc;
      auVar487 = auVar20 * ZEXT816(0x1000003d10) + auVar487;
      uVar557 = auVar487._0_8_;
      uVar554 = uVar557 & 0xfffffffffffff;
      uVar559 = (uVar557 >> 0x34 | auVar487._8_8_ << 0xc) + (uVar555 & 0xffffffffffff);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_a8.n[0];
      auVar277._8_8_ = 0;
      auVar277._0_8_ = uVar554;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_a8.n[1];
      auVar278._8_8_ = 0;
      auVar278._0_8_ = uVar553;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_a8.n[2];
      auVar279._8_8_ = 0;
      auVar279._0_8_ = uVar556;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_a8.n[3];
      auVar280._8_8_ = 0;
      auVar280._0_8_ = uVar552;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_a8.n[4];
      auVar281._8_8_ = 0;
      auVar281._0_8_ = uVar559;
      uVar555 = SUB168(auVar25 * auVar281,0);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar555 & 0xfffffffffffff;
      auVar1 = auVar22 * auVar278 + auVar21 * auVar277 + auVar23 * auVar279 + auVar24 * auVar280 +
               auVar26 * ZEXT816(0x1000003d10);
      uVar557 = auVar1._0_8_;
      auVar488._8_8_ = 0;
      auVar488._0_8_ = uVar557 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_a8.n[0];
      auVar282._8_8_ = 0;
      auVar282._0_8_ = uVar559;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_a8.n[1];
      auVar283._8_8_ = 0;
      auVar283._0_8_ = uVar554;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_a8.n[2];
      auVar284._8_8_ = 0;
      auVar284._0_8_ = uVar553;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_a8.n[3];
      auVar285._8_8_ = 0;
      auVar285._0_8_ = uVar556;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_a8.n[4];
      auVar286._8_8_ = 0;
      auVar286._0_8_ = uVar552;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar555 >> 0x34 | SUB168(auVar25 * auVar281,8) << 0xc;
      auVar1 = auVar27 * auVar282 + auVar488 + auVar28 * auVar283 + auVar29 * auVar284 +
               auVar30 * auVar285 + auVar31 * auVar286 + auVar32 * ZEXT816(0x1000003d10);
      uVar558 = auVar1._0_8_;
      auVar489._8_8_ = 0;
      auVar489._0_8_ = uVar558 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_a8.n[0];
      auVar287._8_8_ = 0;
      auVar287._0_8_ = uVar552;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_a8.n[1];
      auVar288._8_8_ = 0;
      auVar288._0_8_ = uVar559;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_a8.n[2];
      auVar289._8_8_ = 0;
      auVar289._0_8_ = uVar554;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_a8.n[3];
      auVar290._8_8_ = 0;
      auVar290._0_8_ = uVar553;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_a8.n[4];
      auVar291._8_8_ = 0;
      auVar291._0_8_ = uVar556;
      auVar1 = auVar34 * auVar288 + auVar489 + auVar35 * auVar289 + auVar36 * auVar290 +
               auVar37 * auVar291;
      uVar555 = auVar1._0_8_;
      auVar491._8_8_ = 0;
      auVar491._0_8_ = uVar555 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar292._8_8_ = 0;
      auVar292._0_8_ = (uVar555 & 0xfffffffffffff) << 4 | (uVar558 & 0xfffffffffffff) >> 0x30;
      auVar1 = auVar33 * auVar287 + ZEXT816(0x1000003d1) * auVar292;
      uVar560 = auVar1._0_8_;
      auVar490._8_8_ = 0;
      auVar490._0_8_ = uVar560 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_a8.n[0];
      auVar293._8_8_ = 0;
      auVar293._0_8_ = uVar556;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_a8.n[1];
      auVar294._8_8_ = 0;
      auVar294._0_8_ = uVar552;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_a8.n[2];
      auVar295._8_8_ = 0;
      auVar295._0_8_ = uVar559;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_a8.n[3];
      auVar296._8_8_ = 0;
      auVar296._0_8_ = uVar554;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_a8.n[4];
      auVar297._8_8_ = 0;
      auVar297._0_8_ = uVar553;
      auVar2 = auVar40 * auVar295 + auVar491 + auVar41 * auVar296 + auVar42 * auVar297;
      uVar555 = auVar2._0_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar555 & 0xfffffffffffff;
      auVar1 = auVar38 * auVar293 + auVar490 + auVar39 * auVar294 + auVar43 * ZEXT816(0x1000003d10);
      uVar561 = auVar1._0_8_;
      auVar493._8_8_ = 0;
      auVar493._0_8_ = uVar555 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar492._8_8_ = 0;
      auVar492._0_8_ = uVar561 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_a8.n[0];
      auVar298._8_8_ = 0;
      auVar298._0_8_ = uVar553;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_a8.n[1];
      auVar299._8_8_ = 0;
      auVar299._0_8_ = uVar556;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_a8.n[2];
      auVar300._8_8_ = 0;
      auVar300._0_8_ = uVar552;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_a8.n[3];
      auVar301._8_8_ = 0;
      auVar301._0_8_ = uVar559;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_a8.n[4];
      auVar302._8_8_ = 0;
      auVar302._0_8_ = uVar554;
      auVar2 = auVar47 * auVar301 + auVar493 + auVar48 * auVar302;
      uVar553 = auVar2._0_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar553 & 0xfffffffffffff;
      auVar1 = auVar44 * auVar298 + auVar492 + auVar45 * auVar299 + auVar46 * auVar300 +
               auVar49 * ZEXT816(0x1000003d10);
      uVar562 = auVar1._0_8_;
      auVar494._8_8_ = 0;
      auVar494._0_8_ = (uVar562 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar557 & 0xfffffffffffff);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar553 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar494 = auVar50 * ZEXT816(0x1000003d10) + auVar494;
      uVar563 = auVar494._0_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_f0.n[0] * 2;
      auVar303._8_8_ = 0;
      auVar303._0_8_ = local_f0.n[3];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_f0.n[1] * 2;
      auVar304._8_8_ = 0;
      auVar304._0_8_ = local_f0.n[2];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_f0.n[4];
      auVar305._8_8_ = 0;
      auVar305._0_8_ = local_f0.n[4];
      uVar552 = SUB168(auVar53 * auVar305,0);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar552 & 0xfffffffffffff;
      auVar1 = auVar52 * auVar304 + auVar51 * auVar303 + auVar54 * ZEXT816(0x1000003d10);
      uVar556 = auVar1._0_8_;
      auVar495._8_8_ = 0;
      auVar495._0_8_ = uVar556 >> 0x34 | auVar1._8_8_ << 0xc;
      uVar553 = local_f0.n[4] * 2;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_f0.n[0];
      auVar306._8_8_ = 0;
      auVar306._0_8_ = uVar553;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_f0.n[1] * 2;
      auVar307._8_8_ = 0;
      auVar307._0_8_ = local_f0.n[3];
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_f0.n[2];
      auVar308._8_8_ = 0;
      auVar308._0_8_ = local_f0.n[2];
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar552 >> 0x34 | SUB168(auVar53 * auVar305,8) << 0xc;
      auVar1 = auVar55 * auVar306 + auVar495 + auVar56 * auVar307 + auVar57 * auVar308 +
               auVar58 * ZEXT816(0x1000003d10);
      uVar555 = auVar1._0_8_;
      auVar496._8_8_ = 0;
      auVar496._0_8_ = uVar555 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_f0.n[0];
      auVar309._8_8_ = 0;
      auVar309._0_8_ = local_f0.n[0];
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_f0.n[1];
      auVar310._8_8_ = 0;
      auVar310._0_8_ = uVar553;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_f0.n[2] * 2;
      auVar311._8_8_ = 0;
      auVar311._0_8_ = local_f0.n[3];
      auVar1 = auVar60 * auVar310 + auVar496 + auVar61 * auVar311;
      uVar552 = auVar1._0_8_;
      auVar498._8_8_ = 0;
      auVar498._0_8_ = uVar552 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar312._8_8_ = 0;
      auVar312._0_8_ = (uVar552 & 0xfffffffffffff) << 4 | (uVar555 & 0xfffffffffffff) >> 0x30;
      auVar1 = auVar59 * auVar309 + ZEXT816(0x1000003d1) * auVar312;
      uVar554 = auVar1._0_8_;
      auVar497._8_8_ = 0;
      auVar497._0_8_ = uVar554 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_f0.n[0] * 2;
      auVar313._8_8_ = 0;
      auVar313._0_8_ = local_f0.n[1];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = local_f0.n[2];
      auVar314._8_8_ = 0;
      auVar314._0_8_ = uVar553;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_f0.n[3];
      auVar315._8_8_ = 0;
      auVar315._0_8_ = local_f0.n[3];
      auVar2 = auVar63 * auVar314 + auVar498 + auVar64 * auVar315;
      uVar552 = auVar2._0_8_;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar552 & 0xfffffffffffff;
      auVar1 = auVar62 * auVar313 + auVar497 + auVar65 * ZEXT816(0x1000003d10);
      uVar557 = auVar1._0_8_;
      auVar500._8_8_ = 0;
      auVar500._0_8_ = uVar552 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar499._8_8_ = 0;
      auVar499._0_8_ = uVar557 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_f0.n[0] * 2;
      auVar316._8_8_ = 0;
      auVar316._0_8_ = local_f0.n[2];
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_f0.n[1];
      auVar317._8_8_ = 0;
      auVar317._0_8_ = local_f0.n[1];
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_f0.n[3];
      auVar318._8_8_ = 0;
      auVar318._0_8_ = uVar553;
      auVar500 = auVar68 * auVar318 + auVar500;
      uVar553 = auVar500._0_8_;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar553 & 0xfffffffffffff;
      auVar1 = auVar66 * auVar316 + auVar499 + auVar67 * auVar317 + auVar69 * ZEXT816(0x1000003d10);
      uVar559 = auVar1._0_8_;
      auVar501._8_8_ = 0;
      auVar501._0_8_ = (uVar559 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar556 & 0xfffffffffffff);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar553 >> 0x34 | auVar500._8_8_ << 0xc;
      auVar501 = auVar70 * ZEXT816(0x1000003d10) + auVar501;
      uVar564 = auVar501._0_8_;
      uVar553 = (uVar554 & 0xfffffffffffff) * 7;
      uVar552 = (uVar557 & 0xfffffffffffff) * 7;
      uVar556 = (uVar559 & 0xfffffffffffff) * 7;
      uVar554 = (uVar564 & 0xfffffffffffff) * 7;
      uVar555 = ((uVar564 >> 0x34 | auVar501._8_8_ << 0xc) + (uVar555 & 0xffffffffffff)) * 7;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = local_f0.n[0];
      auVar319._8_8_ = 0;
      auVar319._0_8_ = uVar554;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = local_f0.n[1];
      auVar320._8_8_ = 0;
      auVar320._0_8_ = uVar556;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = local_f0.n[2];
      auVar321._8_8_ = 0;
      auVar321._0_8_ = uVar552;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = local_f0.n[3];
      auVar322._8_8_ = 0;
      auVar322._0_8_ = uVar553;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = local_f0.n[4];
      auVar323._8_8_ = 0;
      auVar323._0_8_ = uVar555;
      uVar557 = SUB168(auVar75 * auVar323,0);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar557 & 0xfffffffffffff;
      auVar1 = auVar72 * auVar320 + auVar71 * auVar319 + auVar73 * auVar321 + auVar74 * auVar322 +
               auVar76 * ZEXT816(0x1000003d10);
      uVar559 = auVar1._0_8_;
      auVar502._8_8_ = 0;
      auVar502._0_8_ = uVar559 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = local_f0.n[0];
      auVar324._8_8_ = 0;
      auVar324._0_8_ = uVar555;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = local_f0.n[1];
      auVar325._8_8_ = 0;
      auVar325._0_8_ = uVar554;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_f0.n[2];
      auVar326._8_8_ = 0;
      auVar326._0_8_ = uVar556;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_f0.n[3];
      auVar327._8_8_ = 0;
      auVar327._0_8_ = uVar552;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = local_f0.n[4];
      auVar328._8_8_ = 0;
      auVar328._0_8_ = uVar553;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar557 >> 0x34 | SUB168(auVar75 * auVar323,8) << 0xc;
      auVar1 = auVar77 * auVar324 + auVar502 + auVar78 * auVar325 + auVar79 * auVar326 +
               auVar80 * auVar327 + auVar81 * auVar328 + auVar82 * ZEXT816(0x1000003d10);
      uVar557 = auVar1._0_8_;
      auVar503._8_8_ = 0;
      auVar503._0_8_ = uVar557 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_f0.n[0];
      auVar329._8_8_ = 0;
      auVar329._0_8_ = uVar553;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_f0.n[1];
      auVar330._8_8_ = 0;
      auVar330._0_8_ = uVar555;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_f0.n[2];
      auVar331._8_8_ = 0;
      auVar331._0_8_ = uVar554;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = local_f0.n[3];
      auVar332._8_8_ = 0;
      auVar332._0_8_ = uVar556;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = local_f0.n[4];
      auVar333._8_8_ = 0;
      auVar333._0_8_ = uVar552;
      auVar1 = auVar84 * auVar330 + auVar503 + auVar85 * auVar331 + auVar86 * auVar332 +
               auVar87 * auVar333;
      uVar564 = auVar1._0_8_;
      auVar505._8_8_ = 0;
      auVar505._0_8_ = uVar564 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar334._8_8_ = 0;
      auVar334._0_8_ = (uVar564 & 0xfffffffffffff) << 4 | (uVar557 & 0xfffffffffffff) >> 0x30;
      auVar1 = auVar83 * auVar329 + ZEXT816(0x1000003d1) * auVar334;
      uVar565 = auVar1._0_8_;
      auVar504._8_8_ = 0;
      auVar504._0_8_ = uVar565 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = local_f0.n[0];
      auVar335._8_8_ = 0;
      auVar335._0_8_ = uVar552;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = local_f0.n[1];
      auVar336._8_8_ = 0;
      auVar336._0_8_ = uVar553;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = local_f0.n[2];
      auVar337._8_8_ = 0;
      auVar337._0_8_ = uVar555;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = local_f0.n[3];
      auVar338._8_8_ = 0;
      auVar338._0_8_ = uVar554;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_f0.n[4];
      auVar339._8_8_ = 0;
      auVar339._0_8_ = uVar556;
      auVar2 = auVar90 * auVar337 + auVar505 + auVar91 * auVar338 + auVar92 * auVar339;
      uVar564 = auVar2._0_8_;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar564 & 0xfffffffffffff;
      auVar1 = auVar88 * auVar335 + auVar504 + auVar89 * auVar336 + auVar93 * ZEXT816(0x1000003d10);
      uVar566 = auVar1._0_8_;
      auVar507._8_8_ = 0;
      auVar507._0_8_ = uVar564 >> 0x34 | auVar2._8_8_ << 0xc;
      local_1f8.x.n[1] = uVar566 & 0xfffffffffffff;
      auVar506._8_8_ = 0;
      auVar506._0_8_ = uVar566 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = local_f0.n[0];
      auVar340._8_8_ = 0;
      auVar340._0_8_ = uVar556;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = local_f0.n[1];
      auVar341._8_8_ = 0;
      auVar341._0_8_ = uVar552;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = local_f0.n[2];
      auVar342._8_8_ = 0;
      auVar342._0_8_ = uVar553;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = local_f0.n[3];
      auVar343._8_8_ = 0;
      auVar343._0_8_ = uVar555;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = local_f0.n[4];
      auVar344._8_8_ = 0;
      auVar344._0_8_ = uVar554;
      auVar2 = auVar97 * auVar343 + auVar507 + auVar98 * auVar344;
      uVar553 = auVar2._0_8_;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar553 & 0xfffffffffffff;
      auVar1 = auVar94 * auVar340 + auVar506 + auVar95 * auVar341 + auVar96 * auVar342 +
               auVar99 * ZEXT816(0x1000003d10);
      uVar552 = auVar1._0_8_;
      local_1f8.x.n[2] = uVar552 & 0xfffffffffffff;
      auVar508._8_8_ = 0;
      auVar508._0_8_ = (uVar552 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar559 & 0xfffffffffffff);
      auVar100._8_8_ = 0;
      auVar100._0_8_ = uVar553 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar508 = auVar100 * ZEXT816(0x1000003d10) + auVar508;
      uVar553 = auVar508._0_8_;
      local_1f8.x.n[3] = uVar553 & 0xfffffffffffff;
      local_1f8.x.n[4] = (uVar553 >> 0x34 | auVar508._8_8_ << 0xc) + (uVar557 & 0xffffffffffff);
      local_108 = (uVar562 & 0xfffffffffffff) + local_1f8.x.n[2];
      uStack_100 = (uVar563 & 0xfffffffffffff) + local_1f8.x.n[3];
      local_f8 = (uVar563 >> 0x34 | auVar494._8_8_ << 0xc) + (uVar558 & 0xffffffffffff) +
                 local_1f8.x.n[4];
      local_118 = (uVar560 & 0xfffffffffffff) + (uVar565 & 0xfffffffffffff);
      uStack_110 = (uVar561 & 0xfffffffffffff) + local_1f8.x.n[1];
      auVar101._8_8_ = 0;
      auVar101._0_8_ = local_a8.n[0];
      auVar345._8_8_ = 0;
      auVar345._0_8_ = uStack_100;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = local_a8.n[1];
      auVar346._8_8_ = 0;
      auVar346._0_8_ = local_108;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = local_a8.n[2];
      auVar347._8_8_ = 0;
      auVar347._0_8_ = uStack_110;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_a8.n[3];
      auVar348._8_8_ = 0;
      auVar348._0_8_ = local_118;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = local_a8.n[4];
      auVar349._8_8_ = 0;
      auVar349._0_8_ = local_f8;
      uVar553 = SUB168(auVar105 * auVar349,0);
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uVar553 & 0xfffffffffffff;
      auVar1 = auVar102 * auVar346 + auVar101 * auVar345 + auVar103 * auVar347 + auVar104 * auVar348
               + auVar106 * ZEXT816(0x1000003d10);
      uVar552 = auVar1._0_8_;
      auVar509._8_8_ = 0;
      auVar509._0_8_ = uVar552 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = local_a8.n[0];
      auVar350._8_8_ = 0;
      auVar350._0_8_ = local_f8;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = local_a8.n[1];
      auVar351._8_8_ = 0;
      auVar351._0_8_ = uStack_100;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = local_a8.n[2];
      auVar352._8_8_ = 0;
      auVar352._0_8_ = local_108;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = local_a8.n[3];
      auVar353._8_8_ = 0;
      auVar353._0_8_ = uStack_110;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = local_a8.n[4];
      auVar354._8_8_ = 0;
      auVar354._0_8_ = local_118;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = uVar553 >> 0x34 | SUB168(auVar105 * auVar349,8) << 0xc;
      auVar1 = auVar107 * auVar350 + auVar509 + auVar108 * auVar351 + auVar109 * auVar352 +
               auVar110 * auVar353 + auVar111 * auVar354 + auVar112 * ZEXT816(0x1000003d10);
      uVar553 = auVar1._0_8_;
      auVar510._8_8_ = 0;
      auVar510._0_8_ = uVar553 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = local_a8.n[0];
      auVar355._8_8_ = 0;
      auVar355._0_8_ = local_118;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = local_a8.n[1];
      auVar356._8_8_ = 0;
      auVar356._0_8_ = local_f8;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = local_a8.n[2];
      auVar357._8_8_ = 0;
      auVar357._0_8_ = uStack_100;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = local_a8.n[3];
      auVar358._8_8_ = 0;
      auVar358._0_8_ = local_108;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = local_a8.n[4];
      auVar359._8_8_ = 0;
      auVar359._0_8_ = uStack_110;
      auVar1 = auVar114 * auVar356 + auVar510 + auVar115 * auVar357 + auVar116 * auVar358 +
               auVar117 * auVar359;
      uVar556 = auVar1._0_8_;
      auVar512._8_8_ = 0;
      auVar512._0_8_ = uVar556 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar360._8_8_ = 0;
      auVar360._0_8_ = (uVar556 & 0xfffffffffffff) << 4 | (uVar553 & 0xfffffffffffff) >> 0x30;
      auVar1 = auVar113 * auVar355 + ZEXT816(0x1000003d1) * auVar360;
      uVar556 = auVar1._0_8_;
      local_170.x.n[0] = uVar556 & 0xfffffffffffff;
      auVar511._8_8_ = 0;
      auVar511._0_8_ = uVar556 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_a8.n[0];
      auVar361._8_8_ = 0;
      auVar361._0_8_ = uStack_110;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = local_a8.n[1];
      auVar362._8_8_ = 0;
      auVar362._0_8_ = local_118;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = local_a8.n[2];
      auVar363._8_8_ = 0;
      auVar363._0_8_ = local_f8;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = local_a8.n[3];
      auVar364._8_8_ = 0;
      auVar364._0_8_ = uStack_100;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = local_a8.n[4];
      auVar365._8_8_ = 0;
      auVar365._0_8_ = local_108;
      auVar2 = auVar120 * auVar363 + auVar512 + auVar121 * auVar364 + auVar122 * auVar365;
      uVar556 = auVar2._0_8_;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = uVar556 & 0xfffffffffffff;
      auVar1 = auVar118 * auVar361 + auVar511 + auVar119 * auVar362 +
               auVar123 * ZEXT816(0x1000003d10);
      uVar554 = auVar1._0_8_;
      auVar514._8_8_ = 0;
      auVar514._0_8_ = uVar556 >> 0x34 | auVar2._8_8_ << 0xc;
      local_170.x.n[1] = uVar554 & 0xfffffffffffff;
      auVar513._8_8_ = 0;
      auVar513._0_8_ = uVar554 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = local_a8.n[0];
      auVar366._8_8_ = 0;
      auVar366._0_8_ = local_108;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = local_a8.n[1];
      auVar367._8_8_ = 0;
      auVar367._0_8_ = uStack_110;
      auVar126._8_8_ = 0;
      auVar126._0_8_ = local_a8.n[2];
      auVar368._8_8_ = 0;
      auVar368._0_8_ = local_118;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = local_a8.n[3];
      auVar369._8_8_ = 0;
      auVar369._0_8_ = local_f8;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = local_a8.n[4];
      auVar370._8_8_ = 0;
      auVar370._0_8_ = uStack_100;
      auVar2 = auVar127 * auVar369 + auVar514 + auVar128 * auVar370;
      uVar556 = auVar2._0_8_;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = uVar556 & 0xfffffffffffff;
      auVar1 = auVar124 * auVar366 + auVar513 + auVar125 * auVar367 + auVar126 * auVar368 +
               auVar129 * ZEXT816(0x1000003d10);
      uVar554 = auVar1._0_8_;
      local_170.x.n[2] = uVar554 & 0xfffffffffffff;
      auVar515._8_8_ = 0;
      auVar515._0_8_ = (uVar554 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar552 & 0xfffffffffffff);
      auVar130._8_8_ = 0;
      auVar130._0_8_ = uVar556 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar515 = auVar130 * ZEXT816(0x1000003d10) + auVar515;
      uVar552 = auVar515._0_8_;
      local_170.x.n[3] = uVar552 & 0xfffffffffffff;
      local_170.x.n[4] = (uVar552 >> 0x34 | auVar515._8_8_ << 0xc) + (uVar553 & 0xffffffffffff);
      auVar131._8_8_ = 0;
      auVar131._0_8_ = local_118 * 2;
      auVar371._8_8_ = 0;
      auVar371._0_8_ = uStack_100;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = uStack_110 * 2;
      auVar372._8_8_ = 0;
      auVar372._0_8_ = local_108;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = local_f8;
      auVar373._8_8_ = 0;
      auVar373._0_8_ = local_f8;
      uVar552 = SUB168(auVar133 * auVar373,0);
      auVar134._8_8_ = 0;
      auVar134._0_8_ = uVar552 & 0xfffffffffffff;
      auVar1 = auVar132 * auVar372 + auVar131 * auVar371 + auVar134 * ZEXT816(0x1000003d10);
      uVar553 = auVar1._0_8_;
      local_1f8.x.n[0] = uVar553 & 0xfffffffffffff;
      auVar516._8_8_ = 0;
      auVar516._0_8_ = uVar553 >> 0x34 | auVar1._8_8_ << 0xc;
      uVar553 = local_f8 * 2;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = local_118;
      auVar374._8_8_ = 0;
      auVar374._0_8_ = uVar553;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = uStack_110 * 2;
      auVar375._8_8_ = 0;
      auVar375._0_8_ = uStack_100;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = local_108;
      auVar376._8_8_ = 0;
      auVar376._0_8_ = local_108;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = uVar552 >> 0x34 | SUB168(auVar133 * auVar373,8) << 0xc;
      auVar1 = auVar135 * auVar374 + auVar516 + auVar136 * auVar375 + auVar137 * auVar376 +
               auVar138 * ZEXT816(0x1000003d10);
      local_228.n[0] = auVar1._0_8_;
      auVar517._8_8_ = 0;
      auVar517._0_8_ = local_228.n[0] >> 0x34 | auVar1._8_8_ << 0xc;
      local_250.n[0] = (local_228.n[0] & 0xfffffffffffff) >> 0x30;
      local_228.n[0] = local_228.n[0] & 0xffffffffffff;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = local_118;
      auVar377._8_8_ = 0;
      auVar377._0_8_ = local_118;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uStack_110;
      auVar378._8_8_ = 0;
      auVar378._0_8_ = uVar553;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = local_108 * 2;
      auVar379._8_8_ = 0;
      auVar379._0_8_ = uStack_100;
      auVar1 = auVar140 * auVar378 + auVar517 + auVar141 * auVar379;
      uVar552 = auVar1._0_8_;
      auVar519._8_8_ = 0;
      auVar519._0_8_ = uVar552 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar380._8_8_ = 0;
      auVar380._0_8_ = (uVar552 & 0xfffffffffffff) << 4 | local_250.n[0];
      auVar1 = auVar139 * auVar377 + ZEXT816(0x1000003d1) * auVar380;
      uVar552 = auVar1._0_8_;
      local_170.y.n[0] = uVar552 & 0xfffffffffffff;
      auVar518._8_8_ = 0;
      auVar518._0_8_ = uVar552 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = local_118 * 2;
      auVar381._8_8_ = 0;
      auVar381._0_8_ = uStack_110;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = local_108;
      auVar382._8_8_ = 0;
      auVar382._0_8_ = uVar553;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = uStack_100;
      auVar383._8_8_ = 0;
      auVar383._0_8_ = uStack_100;
      auVar2 = auVar143 * auVar382 + auVar519 + auVar144 * auVar383;
      uVar552 = auVar2._0_8_;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar552 & 0xfffffffffffff;
      auVar1 = auVar142 * auVar381 + auVar518 + auVar145 * ZEXT816(0x1000003d10);
      uVar556 = auVar1._0_8_;
      auVar521._8_8_ = 0;
      auVar521._0_8_ = uVar552 >> 0x34 | auVar2._8_8_ << 0xc;
      local_170.y.n[1] = uVar556 & 0xfffffffffffff;
      auVar520._8_8_ = 0;
      auVar520._0_8_ = uVar556 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = local_118 * 2;
      auVar384._8_8_ = 0;
      auVar384._0_8_ = local_108;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uStack_110;
      auVar385._8_8_ = 0;
      auVar385._0_8_ = uStack_110;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uStack_100;
      auVar386._8_8_ = 0;
      auVar386._0_8_ = uVar553;
      auVar521 = auVar148 * auVar386 + auVar521;
      uVar553 = auVar521._0_8_;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar553 & 0xfffffffffffff;
      auVar1 = auVar146 * auVar384 + auVar520 + auVar147 * auVar385 +
               auVar149 * ZEXT816(0x1000003d10);
      uVar552 = auVar1._0_8_;
      local_170.y.n[2] = uVar552 & 0xfffffffffffff;
      auVar522._8_8_ = 0;
      auVar522._0_8_ = (uVar552 >> 0x34 | auVar1._8_8_ << 0xc) + local_1f8.x.n[0];
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar553 >> 0x34 | auVar521._8_8_ << 0xc;
      auVar522 = auVar150 * ZEXT816(0x1000003d10) + auVar522;
      uVar553 = auVar522._0_8_;
      local_170.y.n[3] = uVar553 & 0xfffffffffffff;
      local_170.y.n[4] = (uVar553 >> 0x34 | auVar522._8_8_ << 0xc) + local_228.n[0];
      local_170.infinity = 0;
      secp256k1_ecmult_const(&local_1f8,&local_170,&local_c8);
      auVar151._8_8_ = 0;
      auVar151._0_8_ = local_1f8.z.n[0] * 2;
      auVar387._8_8_ = 0;
      auVar387._0_8_ = local_1f8.z.n[3];
      auVar152._8_8_ = 0;
      auVar152._0_8_ = local_1f8.z.n[1] * 2;
      auVar388._8_8_ = 0;
      auVar388._0_8_ = local_1f8.z.n[2];
      auVar153._8_8_ = 0;
      auVar153._0_8_ = local_1f8.z.n[4];
      auVar389._8_8_ = 0;
      auVar389._0_8_ = local_1f8.z.n[4];
      uVar552 = SUB168(auVar153 * auVar389,0);
      auVar154._8_8_ = 0;
      auVar154._0_8_ = uVar552 & 0xfffffffffffff;
      auVar1 = auVar152 * auVar388 + auVar151 * auVar387 + auVar154 * ZEXT816(0x1000003d10);
      uVar554 = auVar1._0_8_;
      auVar523._8_8_ = 0;
      auVar523._0_8_ = uVar554 >> 0x34 | auVar1._8_8_ << 0xc;
      uVar553 = local_1f8.z.n[4] * 2;
      auVar155._8_8_ = 0;
      auVar155._0_8_ = local_1f8.z.n[0];
      auVar390._8_8_ = 0;
      auVar390._0_8_ = uVar553;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = local_1f8.z.n[1] * 2;
      auVar391._8_8_ = 0;
      auVar391._0_8_ = local_1f8.z.n[3];
      auVar157._8_8_ = 0;
      auVar157._0_8_ = local_1f8.z.n[2];
      auVar392._8_8_ = 0;
      auVar392._0_8_ = local_1f8.z.n[2];
      auVar158._8_8_ = 0;
      auVar158._0_8_ = uVar552 >> 0x34 | SUB168(auVar153 * auVar389,8) << 0xc;
      auVar1 = auVar155 * auVar390 + auVar523 + auVar156 * auVar391 + auVar157 * auVar392 +
               auVar158 * ZEXT816(0x1000003d10);
      uVar555 = auVar1._0_8_;
      auVar524._8_8_ = 0;
      auVar524._0_8_ = uVar555 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = local_1f8.z.n[0];
      auVar393._8_8_ = 0;
      auVar393._0_8_ = local_1f8.z.n[0];
      auVar160._8_8_ = 0;
      auVar160._0_8_ = local_1f8.z.n[1];
      auVar394._8_8_ = 0;
      auVar394._0_8_ = uVar553;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = local_1f8.z.n[2] * 2;
      auVar395._8_8_ = 0;
      auVar395._0_8_ = local_1f8.z.n[3];
      auVar1 = auVar160 * auVar394 + auVar524 + auVar161 * auVar395;
      uVar552 = auVar1._0_8_;
      auVar526._8_8_ = 0;
      auVar526._0_8_ = uVar552 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar396._8_8_ = 0;
      auVar396._0_8_ = (uVar552 & 0xfffffffffffff) << 4 | (uVar555 & 0xfffffffffffff) >> 0x30;
      auVar1 = auVar159 * auVar393 + ZEXT816(0x1000003d1) * auVar396;
      uVar556 = auVar1._0_8_;
      uVar552 = uVar556 & 0xfffffffffffff;
      auVar525._8_8_ = 0;
      auVar525._0_8_ = uVar556 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar162._8_8_ = 0;
      auVar162._0_8_ = local_1f8.z.n[0] * 2;
      auVar397._8_8_ = 0;
      auVar397._0_8_ = local_1f8.z.n[1];
      auVar163._8_8_ = 0;
      auVar163._0_8_ = local_1f8.z.n[2];
      auVar398._8_8_ = 0;
      auVar398._0_8_ = uVar553;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = local_1f8.z.n[3];
      auVar399._8_8_ = 0;
      auVar399._0_8_ = local_1f8.z.n[3];
      auVar2 = auVar163 * auVar398 + auVar526 + auVar164 * auVar399;
      uVar556 = auVar2._0_8_;
      auVar165._8_8_ = 0;
      auVar165._0_8_ = uVar556 & 0xfffffffffffff;
      auVar1 = auVar162 * auVar397 + auVar525 + auVar165 * ZEXT816(0x1000003d10);
      uVar557 = auVar1._0_8_;
      auVar528._8_8_ = 0;
      auVar528._0_8_ = uVar556 >> 0x34 | auVar2._8_8_ << 0xc;
      uVar556 = uVar557 & 0xfffffffffffff;
      auVar527._8_8_ = 0;
      auVar527._0_8_ = uVar557 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = local_1f8.z.n[0] * 2;
      auVar400._8_8_ = 0;
      auVar400._0_8_ = local_1f8.z.n[2];
      auVar167._8_8_ = 0;
      auVar167._0_8_ = local_1f8.z.n[1];
      auVar401._8_8_ = 0;
      auVar401._0_8_ = local_1f8.z.n[1];
      auVar168._8_8_ = 0;
      auVar168._0_8_ = local_1f8.z.n[3];
      auVar402._8_8_ = 0;
      auVar402._0_8_ = uVar553;
      auVar528 = auVar168 * auVar402 + auVar528;
      uVar557 = auVar528._0_8_;
      auVar169._8_8_ = 0;
      auVar169._0_8_ = uVar557 & 0xfffffffffffff;
      auVar1 = auVar166 * auVar400 + auVar527 + auVar167 * auVar401 +
               auVar169 * ZEXT816(0x1000003d10);
      uVar558 = auVar1._0_8_;
      uVar553 = uVar558 & 0xfffffffffffff;
      auVar529._8_8_ = 0;
      auVar529._0_8_ = (uVar558 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar554 & 0xfffffffffffff);
      auVar170._8_8_ = 0;
      auVar170._0_8_ = uVar557 >> 0x34 | auVar528._8_8_ << 0xc;
      auVar529 = auVar170 * ZEXT816(0x1000003d10) + auVar529;
      uVar557 = auVar529._0_8_;
      uVar554 = uVar557 & 0xfffffffffffff;
      uVar564 = (uVar557 >> 0x34 | auVar529._8_8_ << 0xc) + (uVar555 & 0xffffffffffff);
      auVar171._8_8_ = 0;
      auVar171._0_8_ = local_118;
      auVar403._8_8_ = 0;
      auVar403._0_8_ = uVar554;
      auVar172._8_8_ = 0;
      auVar172._0_8_ = uStack_110;
      auVar404._8_8_ = 0;
      auVar404._0_8_ = uVar553;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = local_108;
      auVar405._8_8_ = 0;
      auVar405._0_8_ = uVar556;
      auVar174._8_8_ = 0;
      auVar174._0_8_ = uStack_100;
      auVar406._8_8_ = 0;
      auVar406._0_8_ = uVar552;
      auVar175._8_8_ = 0;
      auVar175._0_8_ = local_f8;
      auVar407._8_8_ = 0;
      auVar407._0_8_ = uVar564;
      uVar555 = SUB168(auVar175 * auVar407,0);
      auVar176._8_8_ = 0;
      auVar176._0_8_ = uVar555 & 0xfffffffffffff;
      auVar1 = auVar172 * auVar404 + auVar171 * auVar403 + auVar173 * auVar405 + auVar174 * auVar406
               + auVar176 * ZEXT816(0x1000003d10);
      uVar558 = auVar1._0_8_;
      auVar530._8_8_ = 0;
      auVar530._0_8_ = uVar558 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar177._8_8_ = 0;
      auVar177._0_8_ = local_118;
      auVar408._8_8_ = 0;
      auVar408._0_8_ = uVar564;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = uStack_110;
      auVar409._8_8_ = 0;
      auVar409._0_8_ = uVar554;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = local_108;
      auVar410._8_8_ = 0;
      auVar410._0_8_ = uVar553;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = uStack_100;
      auVar411._8_8_ = 0;
      auVar411._0_8_ = uVar556;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = local_f8;
      auVar412._8_8_ = 0;
      auVar412._0_8_ = uVar552;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = uVar555 >> 0x34 | SUB168(auVar175 * auVar407,8) << 0xc;
      auVar1 = auVar177 * auVar408 + auVar530 + auVar178 * auVar409 + auVar179 * auVar410 +
               auVar180 * auVar411 + auVar181 * auVar412 + auVar182 * ZEXT816(0x1000003d10);
      uVar559 = auVar1._0_8_;
      auVar531._8_8_ = 0;
      auVar531._0_8_ = uVar559 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = local_118;
      auVar413._8_8_ = 0;
      auVar413._0_8_ = uVar552;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = uStack_110;
      auVar414._8_8_ = 0;
      auVar414._0_8_ = uVar564;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = local_108;
      auVar415._8_8_ = 0;
      auVar415._0_8_ = uVar554;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = uStack_100;
      auVar416._8_8_ = 0;
      auVar416._0_8_ = uVar553;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = local_f8;
      auVar417._8_8_ = 0;
      auVar417._0_8_ = uVar556;
      auVar1 = auVar184 * auVar414 + auVar531 + auVar185 * auVar415 + auVar186 * auVar416 +
               auVar187 * auVar417;
      uVar555 = auVar1._0_8_;
      auVar533._8_8_ = 0;
      auVar533._0_8_ = uVar555 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar418._8_8_ = 0;
      auVar418._0_8_ = (uVar555 & 0xfffffffffffff) << 4 | (uVar559 & 0xfffffffffffff) >> 0x30;
      auVar1 = auVar183 * auVar413 + ZEXT816(0x1000003d1) * auVar418;
      uVar557 = auVar1._0_8_;
      uVar555 = uVar557 & 0xfffffffffffff;
      auVar532._8_8_ = 0;
      auVar532._0_8_ = uVar557 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar188._8_8_ = 0;
      auVar188._0_8_ = local_118;
      auVar419._8_8_ = 0;
      auVar419._0_8_ = uVar556;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = uStack_110;
      auVar420._8_8_ = 0;
      auVar420._0_8_ = uVar552;
      auVar190._8_8_ = 0;
      auVar190._0_8_ = local_108;
      auVar421._8_8_ = 0;
      auVar421._0_8_ = uVar564;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = uStack_100;
      auVar422._8_8_ = 0;
      auVar422._0_8_ = uVar554;
      auVar192._8_8_ = 0;
      auVar192._0_8_ = local_f8;
      auVar423._8_8_ = 0;
      auVar423._0_8_ = uVar553;
      auVar2 = auVar190 * auVar421 + auVar533 + auVar191 * auVar422 + auVar192 * auVar423;
      uVar557 = auVar2._0_8_;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = uVar557 & 0xfffffffffffff;
      auVar1 = auVar188 * auVar419 + auVar532 + auVar189 * auVar420 +
               auVar193 * ZEXT816(0x1000003d10);
      uVar560 = auVar1._0_8_;
      auVar535._8_8_ = 0;
      auVar535._0_8_ = uVar557 >> 0x34 | auVar2._8_8_ << 0xc;
      uVar557 = uVar560 & 0xfffffffffffff;
      auVar534._8_8_ = 0;
      auVar534._0_8_ = uVar560 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = local_118;
      auVar424._8_8_ = 0;
      auVar424._0_8_ = uVar553;
      auVar195._8_8_ = 0;
      auVar195._0_8_ = uStack_110;
      auVar425._8_8_ = 0;
      auVar425._0_8_ = uVar556;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = local_108;
      auVar426._8_8_ = 0;
      auVar426._0_8_ = uVar552;
      auVar197._8_8_ = 0;
      auVar197._0_8_ = uStack_100;
      auVar427._8_8_ = 0;
      auVar427._0_8_ = uVar564;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = local_f8;
      auVar428._8_8_ = 0;
      auVar428._0_8_ = uVar554;
      auVar2 = auVar197 * auVar427 + auVar535 + auVar198 * auVar428;
      uVar552 = auVar2._0_8_;
      auVar199._8_8_ = 0;
      auVar199._0_8_ = uVar552 & 0xfffffffffffff;
      auVar1 = auVar194 * auVar424 + auVar534 + auVar195 * auVar425 + auVar196 * auVar426 +
               auVar199 * ZEXT816(0x1000003d10);
      uVar556 = auVar1._0_8_;
      uVar553 = uVar556 & 0xfffffffffffff;
      auVar536._8_8_ = 0;
      auVar536._0_8_ = (uVar556 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar558 & 0xfffffffffffff);
      auVar200._8_8_ = 0;
      auVar200._0_8_ = uVar552 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar536 = auVar200 * ZEXT816(0x1000003d10) + auVar536;
      uVar556 = auVar536._0_8_;
      uVar552 = uVar556 & 0xfffffffffffff;
      uVar558 = (uVar556 >> 0x34 | auVar536._8_8_ << 0xc) + (uVar559 & 0xffffffffffff);
      auVar201._8_8_ = 0;
      auVar201._0_8_ = local_f0.n[0];
      auVar429._8_8_ = 0;
      auVar429._0_8_ = uVar552;
      auVar202._8_8_ = 0;
      auVar202._0_8_ = local_f0.n[1];
      auVar430._8_8_ = 0;
      auVar430._0_8_ = uVar553;
      auVar203._8_8_ = 0;
      auVar203._0_8_ = local_f0.n[2];
      auVar431._8_8_ = 0;
      auVar431._0_8_ = uVar557;
      auVar204._8_8_ = 0;
      auVar204._0_8_ = local_f0.n[3];
      auVar432._8_8_ = 0;
      auVar432._0_8_ = uVar555;
      auVar205._8_8_ = 0;
      auVar205._0_8_ = local_f0.n[4];
      auVar433._8_8_ = 0;
      auVar433._0_8_ = uVar558;
      uVar556 = SUB168(auVar205 * auVar433,0);
      auVar206._8_8_ = 0;
      auVar206._0_8_ = uVar556 & 0xfffffffffffff;
      auVar1 = auVar202 * auVar430 + auVar201 * auVar429 + auVar203 * auVar431 + auVar204 * auVar432
               + auVar206 * ZEXT816(0x1000003d10);
      uVar554 = auVar1._0_8_;
      local_250.n[0] = uVar554 & 0xfffffffffffff;
      auVar537._8_8_ = 0;
      auVar537._0_8_ = uVar554 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar207._8_8_ = 0;
      auVar207._0_8_ = local_f0.n[0];
      auVar434._8_8_ = 0;
      auVar434._0_8_ = uVar558;
      auVar208._8_8_ = 0;
      auVar208._0_8_ = local_f0.n[1];
      auVar435._8_8_ = 0;
      auVar435._0_8_ = uVar552;
      auVar209._8_8_ = 0;
      auVar209._0_8_ = local_f0.n[2];
      auVar436._8_8_ = 0;
      auVar436._0_8_ = uVar553;
      auVar210._8_8_ = 0;
      auVar210._0_8_ = local_f0.n[3];
      auVar437._8_8_ = 0;
      auVar437._0_8_ = uVar557;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = local_f0.n[4];
      auVar438._8_8_ = 0;
      auVar438._0_8_ = uVar555;
      auVar212._8_8_ = 0;
      auVar212._0_8_ = uVar556 >> 0x34 | SUB168(auVar205 * auVar433,8) << 0xc;
      auVar1 = auVar207 * auVar434 + auVar537 + auVar208 * auVar435 + auVar209 * auVar436 +
               auVar210 * auVar437 + auVar211 * auVar438 + auVar212 * ZEXT816(0x1000003d10);
      uVar556 = auVar1._0_8_;
      auVar538._8_8_ = 0;
      auVar538._0_8_ = uVar556 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar213._8_8_ = 0;
      auVar213._0_8_ = local_f0.n[0];
      auVar439._8_8_ = 0;
      auVar439._0_8_ = uVar555;
      auVar214._8_8_ = 0;
      auVar214._0_8_ = local_f0.n[1];
      auVar440._8_8_ = 0;
      auVar440._0_8_ = uVar558;
      auVar215._8_8_ = 0;
      auVar215._0_8_ = local_f0.n[2];
      auVar441._8_8_ = 0;
      auVar441._0_8_ = uVar552;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = local_f0.n[3];
      auVar442._8_8_ = 0;
      auVar442._0_8_ = uVar553;
      auVar217._8_8_ = 0;
      auVar217._0_8_ = local_f0.n[4];
      auVar443._8_8_ = 0;
      auVar443._0_8_ = uVar557;
      auVar1 = auVar214 * auVar440 + auVar538 + auVar215 * auVar441 + auVar216 * auVar442 +
               auVar217 * auVar443;
      uVar554 = auVar1._0_8_;
      auVar540._8_8_ = 0;
      auVar540._0_8_ = uVar554 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar444._8_8_ = 0;
      auVar444._0_8_ = (uVar554 & 0xfffffffffffff) << 4 | (uVar556 & 0xfffffffffffff) >> 0x30;
      auVar1 = auVar213 * auVar439 + ZEXT816(0x1000003d1) * auVar444;
      uVar554 = auVar1._0_8_;
      local_228.n[0] = uVar554 & 0xfffffffffffff;
      auVar539._8_8_ = 0;
      auVar539._0_8_ = uVar554 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar218._8_8_ = 0;
      auVar218._0_8_ = local_f0.n[0];
      auVar445._8_8_ = 0;
      auVar445._0_8_ = uVar557;
      auVar219._8_8_ = 0;
      auVar219._0_8_ = local_f0.n[1];
      auVar446._8_8_ = 0;
      auVar446._0_8_ = uVar555;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = local_f0.n[2];
      auVar447._8_8_ = 0;
      auVar447._0_8_ = uVar558;
      auVar221._8_8_ = 0;
      auVar221._0_8_ = local_f0.n[3];
      auVar448._8_8_ = 0;
      auVar448._0_8_ = uVar552;
      auVar222._8_8_ = 0;
      auVar222._0_8_ = local_f0.n[4];
      auVar449._8_8_ = 0;
      auVar449._0_8_ = uVar553;
      auVar2 = auVar220 * auVar447 + auVar540 + auVar221 * auVar448 + auVar222 * auVar449;
      uVar554 = auVar2._0_8_;
      auVar223._8_8_ = 0;
      auVar223._0_8_ = uVar554 & 0xfffffffffffff;
      auVar1 = auVar218 * auVar445 + auVar539 + auVar219 * auVar446 +
               auVar223 * ZEXT816(0x1000003d10);
      uVar559 = auVar1._0_8_;
      auVar542._8_8_ = 0;
      auVar542._0_8_ = uVar554 >> 0x34 | auVar2._8_8_ << 0xc;
      local_228.n[1] = uVar559 & 0xfffffffffffff;
      auVar541._8_8_ = 0;
      auVar541._0_8_ = uVar559 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar224._8_8_ = 0;
      auVar224._0_8_ = local_f0.n[0];
      auVar450._8_8_ = 0;
      auVar450._0_8_ = uVar553;
      auVar225._8_8_ = 0;
      auVar225._0_8_ = local_f0.n[1];
      auVar451._8_8_ = 0;
      auVar451._0_8_ = uVar557;
      auVar226._8_8_ = 0;
      auVar226._0_8_ = local_f0.n[2];
      auVar452._8_8_ = 0;
      auVar452._0_8_ = uVar555;
      auVar227._8_8_ = 0;
      auVar227._0_8_ = local_f0.n[3];
      auVar453._8_8_ = 0;
      auVar453._0_8_ = uVar558;
      auVar228._8_8_ = 0;
      auVar228._0_8_ = local_f0.n[4];
      auVar454._8_8_ = 0;
      auVar454._0_8_ = uVar552;
      auVar2 = auVar227 * auVar453 + auVar542 + auVar228 * auVar454;
      uVar553 = auVar2._0_8_;
      auVar229._8_8_ = 0;
      auVar229._0_8_ = uVar553 & 0xfffffffffffff;
      auVar1 = auVar224 * auVar450 + auVar541 + auVar225 * auVar451 + auVar226 * auVar452 +
               auVar229 * ZEXT816(0x1000003d10);
      uVar552 = auVar1._0_8_;
      local_228.n[2] = uVar552 & 0xfffffffffffff;
      auVar543._8_8_ = 0;
      auVar543._0_8_ = (uVar552 >> 0x34 | auVar1._8_8_ << 0xc) + local_250.n[0];
      auVar230._8_8_ = 0;
      auVar230._0_8_ = uVar553 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar543 = auVar230 * ZEXT816(0x1000003d10) + auVar543;
      uVar553 = auVar543._0_8_;
      local_228.n[3] = uVar553 & 0xfffffffffffff;
      local_228.n[4] = (uVar553 >> 0x34 | auVar543._8_8_ << 0xc) + (uVar556 & 0xffffffffffff);
      secp256k1_fe_impl_inv(&local_228,&local_228);
      auVar231._8_8_ = 0;
      auVar231._0_8_ = local_228.n[0];
      auVar455._8_8_ = 0;
      auVar455._0_8_ = local_1f8.x.n[3];
      auVar232._8_8_ = 0;
      auVar232._0_8_ = local_228.n[1];
      auVar456._8_8_ = 0;
      auVar456._0_8_ = local_1f8.x.n[2];
      auVar233._8_8_ = 0;
      auVar233._0_8_ = local_228.n[2];
      auVar457._8_8_ = 0;
      auVar457._0_8_ = local_1f8.x.n[1];
      auVar234._8_8_ = 0;
      auVar234._0_8_ = local_228.n[3];
      auVar458._8_8_ = 0;
      auVar458._0_8_ = local_1f8.x.n[0];
      auVar235._8_8_ = 0;
      auVar235._0_8_ = local_228.n[4];
      auVar459._8_8_ = 0;
      auVar459._0_8_ = local_1f8.x.n[4];
      uVar553 = SUB168(auVar235 * auVar459,0);
      auVar236._8_8_ = 0;
      auVar236._0_8_ = uVar553 & 0xfffffffffffff;
      auVar1 = auVar232 * auVar456 + auVar231 * auVar455 + auVar233 * auVar457 + auVar234 * auVar458
               + auVar236 * ZEXT816(0x1000003d10);
      uVar552 = auVar1._0_8_;
      auVar544._8_8_ = 0;
      auVar544._0_8_ = uVar552 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar237._8_8_ = 0;
      auVar237._0_8_ = local_228.n[0];
      auVar460._8_8_ = 0;
      auVar460._0_8_ = local_1f8.x.n[4];
      auVar238._8_8_ = 0;
      auVar238._0_8_ = local_228.n[1];
      auVar461._8_8_ = 0;
      auVar461._0_8_ = local_1f8.x.n[3];
      auVar239._8_8_ = 0;
      auVar239._0_8_ = local_228.n[2];
      auVar462._8_8_ = 0;
      auVar462._0_8_ = local_1f8.x.n[2];
      auVar240._8_8_ = 0;
      auVar240._0_8_ = local_228.n[3];
      auVar463._8_8_ = 0;
      auVar463._0_8_ = local_1f8.x.n[1];
      auVar241._8_8_ = 0;
      auVar241._0_8_ = local_228.n[4];
      auVar464._8_8_ = 0;
      auVar464._0_8_ = local_1f8.x.n[0];
      auVar242._8_8_ = 0;
      auVar242._0_8_ = uVar553 >> 0x34 | SUB168(auVar235 * auVar459,8) << 0xc;
      auVar1 = auVar237 * auVar460 + auVar544 + auVar238 * auVar461 + auVar239 * auVar462 +
               auVar240 * auVar463 + auVar241 * auVar464 + auVar242 * ZEXT816(0x1000003d10);
      uVar553 = auVar1._0_8_;
      auVar545._8_8_ = 0;
      auVar545._0_8_ = uVar553 >> 0x34 | auVar1._8_8_ << 0xc;
      local_200 = (uVar553 & 0xfffffffffffff) >> 0x30;
      auVar243._8_8_ = 0;
      auVar243._0_8_ = local_228.n[0];
      auVar465._8_8_ = 0;
      auVar465._0_8_ = local_1f8.x.n[0];
      auVar244._8_8_ = 0;
      auVar244._0_8_ = local_228.n[1];
      auVar466._8_8_ = 0;
      auVar466._0_8_ = local_1f8.x.n[4];
      auVar245._8_8_ = 0;
      auVar245._0_8_ = local_228.n[2];
      auVar467._8_8_ = 0;
      auVar467._0_8_ = local_1f8.x.n[3];
      auVar246._8_8_ = 0;
      auVar246._0_8_ = local_228.n[3];
      auVar468._8_8_ = 0;
      auVar468._0_8_ = local_1f8.x.n[2];
      auVar247._8_8_ = 0;
      auVar247._0_8_ = local_228.n[4];
      auVar469._8_8_ = 0;
      auVar469._0_8_ = local_1f8.x.n[1];
      auVar1 = auVar244 * auVar466 + auVar545 + auVar245 * auVar467 + auVar246 * auVar468 +
               auVar247 * auVar469;
      uVar556 = auVar1._0_8_;
      auVar547._8_8_ = 0;
      auVar547._0_8_ = uVar556 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar470._8_8_ = 0;
      auVar470._0_8_ = (uVar556 & 0xfffffffffffff) << 4 | local_200;
      auVar1 = auVar243 * auVar465 + ZEXT816(0x1000003d1) * auVar470;
      uVar556 = auVar1._0_8_;
      local_250.n[0] = uVar556 & 0xfffffffffffff;
      auVar546._8_8_ = 0;
      auVar546._0_8_ = uVar556 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar248._8_8_ = 0;
      auVar248._0_8_ = local_228.n[0];
      auVar471._8_8_ = 0;
      auVar471._0_8_ = local_1f8.x.n[1];
      auVar249._8_8_ = 0;
      auVar249._0_8_ = local_228.n[1];
      auVar472._8_8_ = 0;
      auVar472._0_8_ = local_1f8.x.n[0];
      auVar250._8_8_ = 0;
      auVar250._0_8_ = local_228.n[2];
      auVar473._8_8_ = 0;
      auVar473._0_8_ = local_1f8.x.n[4];
      auVar251._8_8_ = 0;
      auVar251._0_8_ = local_228.n[3];
      auVar474._8_8_ = 0;
      auVar474._0_8_ = local_1f8.x.n[3];
      auVar252._8_8_ = 0;
      auVar252._0_8_ = local_228.n[4];
      auVar475._8_8_ = 0;
      auVar475._0_8_ = local_1f8.x.n[2];
      auVar2 = auVar250 * auVar473 + auVar547 + auVar251 * auVar474 + auVar252 * auVar475;
      uVar556 = auVar2._0_8_;
      auVar253._8_8_ = 0;
      auVar253._0_8_ = uVar556 & 0xfffffffffffff;
      auVar1 = auVar248 * auVar471 + auVar546 + auVar249 * auVar472 +
               auVar253 * ZEXT816(0x1000003d10);
      uVar554 = auVar1._0_8_;
      auVar549._8_8_ = 0;
      auVar549._0_8_ = uVar556 >> 0x34 | auVar2._8_8_ << 0xc;
      local_250.n[1] = uVar554 & 0xfffffffffffff;
      auVar548._8_8_ = 0;
      auVar548._0_8_ = uVar554 >> 0x34 | auVar1._8_8_ << 0xc;
      auVar254._8_8_ = 0;
      auVar254._0_8_ = local_228.n[0];
      auVar476._8_8_ = 0;
      auVar476._0_8_ = local_1f8.x.n[2];
      auVar255._8_8_ = 0;
      auVar255._0_8_ = local_228.n[1];
      auVar477._8_8_ = 0;
      auVar477._0_8_ = local_1f8.x.n[1];
      auVar256._8_8_ = 0;
      auVar256._0_8_ = local_228.n[2];
      auVar478._8_8_ = 0;
      auVar478._0_8_ = local_1f8.x.n[0];
      auVar257._8_8_ = 0;
      auVar257._0_8_ = local_228.n[3];
      auVar479._8_8_ = 0;
      auVar479._0_8_ = local_1f8.x.n[4];
      auVar258._8_8_ = 0;
      auVar258._0_8_ = local_228.n[4];
      auVar480._8_8_ = 0;
      auVar480._0_8_ = local_1f8.x.n[3];
      auVar2 = auVar257 * auVar479 + auVar549 + auVar258 * auVar480;
      uVar556 = auVar2._0_8_;
      auVar259._8_8_ = 0;
      auVar259._0_8_ = uVar556 & 0xfffffffffffff;
      auVar1 = auVar254 * auVar476 + auVar548 + auVar255 * auVar477 + auVar256 * auVar478 +
               auVar259 * ZEXT816(0x1000003d10);
      uVar554 = auVar1._0_8_;
      local_250.n[2] = uVar554 & 0xfffffffffffff;
      auVar550._8_8_ = 0;
      auVar550._0_8_ = (uVar554 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar552 & 0xfffffffffffff);
      auVar260._8_8_ = 0;
      auVar260._0_8_ = uVar556 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar550 = auVar260 * ZEXT816(0x1000003d10) + auVar550;
      uVar552 = auVar550._0_8_;
      local_250.n[3] = uVar552 & 0xfffffffffffff;
      local_250.n[4] = (uVar552 >> 0x34 | auVar550._8_8_ << 0xc) + (uVar553 & 0xffffffffffff);
      secp256k1_fe_impl_normalize(&local_250);
      secp256k1_fe_impl_get_b32((uchar *)&local_1f8,&local_250);
      iVar551 = (*hashfp)(local_268,(uchar *)&local_1f8,local_260,local_258,data);
      return (uint)(local_26c == 0 && iVar551 != 0);
    }
    secp256k1_ellswift_xdh_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    memset(sx, 0, 32);
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}